

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O3

gnode_t * parse_declaration_statement(gravity_parser_t *parser)

{
  gnode_n gVar1;
  gliteral_t gVar2;
  gravity_lexer_t *pgVar3;
  gravity_lexer_t *lexer;
  long *plVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  gtoken_s token_00;
  gtoken_s token_01;
  gtoken_s token_02;
  gtoken_s token_03;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  bool bVar21;
  _Bool _Var22;
  _Bool _Var23;
  gtoken_t gVar24;
  gtoken_t access_specifier;
  gtoken_t storage_specifier;
  gtoken_t gVar25;
  uint32_t uVar26;
  gnode_t *pgVar27;
  gnode_t *pgVar28;
  char *pcVar29;
  symboltable_t *symtable;
  gnode_r *pgVar30;
  gnode_t **ppgVar31;
  gnode_r *pgVar32;
  gnode_r *declarations;
  char *pcVar33;
  char *pcVar34;
  gtoken_s *pgVar35;
  gnode_t *pgVar36;
  gliteral_t gVar37;
  size_t sVar38;
  size_t sVar39;
  gnode_t *pgVar40;
  gnode_variable_decl_t *vdec_node;
  int iVar41;
  gravity_parser_t *parser_00;
  gtoken_s enum_token;
  gtoken_s token;
  gnode_t *local_158;
  long local_150;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  char *local_f0;
  
  pgVar3 = parser->lexer->p[parser->lexer->n - 1];
  gVar24 = gravity_lexer_peek(pgVar3);
  _Var22 = token_isaccess_specifier(gVar24);
  storage_specifier = TOK_EOF;
  access_specifier = TOK_EOF;
  if (_Var22) {
    access_specifier = gravity_lexer_next(pgVar3);
    gVar24 = gravity_lexer_peek(pgVar3);
  }
  _Var22 = token_isstorage_specifier(gVar24);
  if (_Var22) {
    storage_specifier = gravity_lexer_next(pgVar3);
    gVar24 = gravity_lexer_peek(pgVar3);
  }
  if ((int)gVar24 < 0x17) {
    if (gVar24 == TOK_MACRO) {
      parse_macro_statement(parser);
      return (gnode_t *)0x0;
    }
    if (gVar24 == TOK_KEY_FUNC) {
      pgVar28 = parse_function(parser,true,access_specifier,storage_specifier);
      pgVar27 = get_enclosing((gravity_parser_t *)parser->declarations,NODE_FUNCTION_DECL);
      if (pgVar27 != (gnode_t *)0x0) {
        *(undefined1 *)((long)&pgVar28[1].token.value + 5) = 1;
        pgVar28 = local_store_declaration
                            (parser,*(char **)&pgVar28[1].token.colno,(char *)0x0,access_specifier,
                             storage_specifier,pgVar28);
        return pgVar28;
      }
      return pgVar28;
    }
    goto switchD_0010fbd8_caseD_1a;
  }
  switch(gVar24) {
  case TOK_KEY_ENUM:
    pgVar3 = parser->lexer->p[parser->lexer->n - 1];
    gVar24 = gravity_lexer_next(pgVar3);
    gravity_lexer_token(pgVar3);
    if (gVar24 != TOK_KEY_ENUM) {
      __assert_fail("type == TOK_KEY_ENUM",
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                    ,0x599,"gnode_t *parse_enum_declaration(gravity_parser_t *, gtoken_t, gtoken_t)"
                   );
    }
    pcVar29 = parse_identifier(parser);
    _Var22 = parse_required(parser,TOK_OP_OPEN_CURLYBRACE);
    if (!_Var22) {
      return (gnode_t *)0x0;
    }
    symtable = symboltable_create(SYMTABLE_TAG_ENUM);
    sVar38 = parser->declarations->n;
    iVar41 = 0;
    if (sVar38 == 0) {
      pgVar28 = (gnode_t *)0x0;
    }
    else {
      pgVar28 = parser->declarations->p[sVar38 - 1];
    }
    token_01.lineno = uStack_10c;
    token_01.type = local_110;
    token_01.colno = uStack_108;
    token_01.position = uStack_104;
    token_01.bytes = local_100;
    token_01.length = uStack_fc;
    token_01.fileid = uStack_f8;
    token_01.builtin = uStack_f4;
    token_01.value = local_f0;
    pgVar28 = gnode_enum_decl_create
                        (token_01,pcVar29,access_specifier,storage_specifier,symtable,pgVar28);
    gVar24 = gravity_lexer_peek(pgVar3);
    if (gVar24 != TOK_OP_CLOSED_CURLYBRACE) {
      local_158._0_4_ = LITERAL_INT;
      local_150 = 0;
      iVar41 = 0;
      do {
        gVar24 = gravity_lexer_peek(pgVar3);
        if (gVar24 == TOK_IDENTIFIER) {
          pcVar33 = parse_identifier(parser);
          gravity_lexer_token(pgVar3);
          if (pcVar33 == (char *)0x0) goto LAB_0011069f;
          bVar21 = false;
        }
        else {
LAB_0011069f:
          pcVar33 = token_name(gVar24);
          report_error(parser,GRAVITY_ERROR_SYNTAX,0x13fe08,pcVar33);
          bVar21 = true;
          pcVar33 = (char *)0x0;
        }
        gVar24 = gravity_lexer_peek(pgVar3);
        gravity_lexer_token(pgVar3);
        _Var22 = token_isvariable_assignment(gVar24);
        if (((!_Var22) && (gVar24 != TOK_OP_COMMA)) && (gVar24 != TOK_OP_CLOSED_CURLYBRACE)) {
          pcVar34 = token_name(gVar24);
          report_error(parser,GRAVITY_ERROR_SYNTAX,0x13fe2d,pcVar34);
        }
        _Var22 = token_isvariable_assignment(gVar24);
        if ((!_Var22) && ((gliteral_t)local_158 != LITERAL_INT)) {
          pcVar34 = token_name(gVar24);
          report_error(parser,GRAVITY_ERROR_SYNTAX,0x13fe48,pcVar34);
        }
        _Var22 = token_isvariable_assignment(gVar24);
        if (_Var22) {
          gravity_lexer_next(pgVar3);
          pgVar27 = parse_precedence(parser,PREC_LOWEST);
          if (pgVar27 == (gnode_t *)0x0) goto LAB_0011085e;
          pgVar40 = pgVar27;
          if (pgVar27->tag == NODE_LITERAL_EXPR) {
LAB_001109af:
            gVar2 = pgVar40[1].tag;
            if (((iVar41 != 0) || (LITERAL_BOOL < gVar2)) || (gVar2 == LITERAL_INT)) {
              gVar37 = (gliteral_t)local_158;
              if (gVar2 != (gliteral_t)local_158) {
                pcVar34 = token_literal_name((gliteral_t)local_158);
                report_error(parser,GRAVITY_ERROR_SYNTAX,0x13ff0c,pcVar34);
                gVar37 = pgVar40[1].tag;
              }
              gVar2 = (gliteral_t)local_158;
              if (gVar37 == LITERAL_INT) {
                local_150 = *(long *)&pgVar40[1].block_length + 1;
              }
            }
            goto LAB_001108d4;
          }
          if ((pgVar27->tag == NODE_UNARY_EXPR) &&
             (pgVar40 = *(gnode_t **)&pgVar27[1].block_length, pgVar40->tag == NODE_LITERAL_EXPR)) {
            if ((pgVar27[1].tag & ~NODE_COMPOUND_STAT) == 0x32) {
              if (pgVar40[1].tag - NODE_COMPOUND_STAT < 2) {
                if (pgVar27[1].tag == 0x33) {
                  pgVar35 = &pgVar27->token;
                  pgVar30 = parser->declarations;
                  sVar38 = pgVar30->n;
                  if (pgVar40[1].tag == NODE_COMPOUND_STAT) {
                    if (sVar38 == 0) {
                      pgVar36 = (gnode_t *)0x0;
                    }
                    else {
                      pgVar36 = pgVar30->p[sVar38 - 1];
                    }
                    uVar10 = (pgVar27->token).position;
                    uVar18 = pgVar35->type;
                    uVar19 = pgVar35->lineno;
                    uVar20 = pgVar35->colno;
                    token_03.colno = uVar20;
                    token_03.lineno = uVar19;
                    token_03.type = uVar18;
                    uVar11 = (pgVar27->token).bytes;
                    uVar12 = (pgVar27->token).length;
                    uVar13 = (pgVar27->token).fileid;
                    uVar14 = (pgVar27->token).builtin;
                    token_03.position = uVar10;
                    token_03.bytes = uVar11;
                    token_03.length = uVar12;
                    token_03.fileid = uVar13;
                    token_03.builtin = uVar14;
                    token_03.value = (pgVar27->token).value;
                    pgVar36 = gnode_literal_float_expr_create
                                        (token_03,-*(double *)&pgVar40[1].block_length,pgVar36);
                  }
                  else {
                    pgVar36 = (gnode_t *)0x0;
                    if (sVar38 != 0) {
                      pgVar36 = pgVar30->p[sVar38 - 1];
                    }
                    uVar5 = (pgVar27->token).position;
                    uVar15 = pgVar35->type;
                    uVar16 = pgVar35->lineno;
                    uVar17 = pgVar35->colno;
                    token_02.colno = uVar17;
                    token_02.lineno = uVar16;
                    token_02.type = uVar15;
                    uVar6 = (pgVar27->token).bytes;
                    uVar7 = (pgVar27->token).length;
                    uVar8 = (pgVar27->token).fileid;
                    uVar9 = (pgVar27->token).builtin;
                    token_02.position = uVar5;
                    token_02.bytes = uVar6;
                    token_02.length = uVar7;
                    token_02.fileid = uVar8;
                    token_02.builtin = uVar9;
                    token_02.value = (pgVar27->token).value;
                    pgVar36 = gnode_literal_int_expr_create
                                        (token_02,-*(long *)&pgVar40[1].block_length,pgVar36);
                  }
                  if (pgVar36 != (gnode_t *)0x0) {
                    gnode_free(pgVar27);
                    pgVar27 = pgVar36;
                    pgVar40 = pgVar36;
                  }
                }
                goto LAB_001109af;
              }
              pcVar33 = 
              "A number is expected after a + or - unary expression in an enum definition.";
            }
            else {
              pcVar33 = "Only + or - allowed in enum value definition.";
            }
          }
          else {
            pcVar33 = "Literal value expected here.";
          }
          report_error(parser,GRAVITY_ERROR_SYNTAX,pcVar33);
        }
        else {
LAB_0011085e:
          sVar38 = parser->declarations->n;
          if (sVar38 == 0) {
            pgVar27 = (gnode_t *)0x0;
          }
          else {
            pgVar27 = parser->declarations->p[sVar38 - 1];
          }
          pgVar27 = gnode_literal_int_expr_create((gtoken_s)ZEXT840(0),local_150,pgVar27);
          local_150 = local_150 + 1;
          gVar2 = (gliteral_t)local_158;
LAB_001108d4:
          local_158._0_4_ = gVar2;
          if (!bVar21) {
            _Var22 = symboltable_insert(symtable,pcVar33,pgVar27);
            if (!_Var22) {
              report_error(parser,GRAVITY_ERROR_SYNTAX,0x13ff34,pcVar33);
              gnode_free(pgVar27);
            }
            free(pcVar33);
          }
          iVar41 = iVar41 + 1;
          gVar24 = gravity_lexer_peek(pgVar3);
          if (gVar24 != TOK_OP_COMMA) break;
          gravity_lexer_next(pgVar3);
        }
        gVar24 = gravity_lexer_peek(pgVar3);
      } while (gVar24 != TOK_OP_CLOSED_CURLYBRACE);
    }
    parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
    pgVar3 = parser->lexer->p[parser->lexer->n - 1];
    gVar24 = gravity_lexer_peek(pgVar3);
    if (gVar24 == TOK_OP_SEMICOLON) {
      gravity_lexer_next(pgVar3);
    }
    if (iVar41 == 0) {
      report_error(parser,GRAVITY_ERROR_SYNTAX,0x13ff4e,pcVar29);
    }
    pgVar27 = get_enclosing((gravity_parser_t *)parser->declarations,NODE_FUNCTION_DECL);
    if (pgVar27 == (gnode_t *)0x0) {
      return pgVar28;
    }
    pcVar33 = (char *)0x0;
    break;
  case TOK_KEY_CLASS:
  case TOK_KEY_STRUCT:
    pgVar3 = parser->lexer->p[parser->lexer->n - 1];
    gVar24 = gravity_lexer_next(pgVar3);
    gravity_lexer_token(pgVar3);
    pcVar29 = parse_identifier(parser);
    gVar25 = gravity_lexer_peek(pgVar3);
    if (gVar25 == TOK_OP_COLON) {
      gravity_lexer_next(pgVar3);
      local_158 = parse_id(parser);
    }
    else {
      local_158 = (gnode_t *)0x0;
    }
    gVar25 = gravity_lexer_peek(pgVar3);
    if (gVar25 == TOK_OP_LESS) {
      gravity_lexer_next(pgVar3);
      lexer = parser->lexer->p[parser->lexer->n - 1];
      gVar25 = gravity_lexer_peek(lexer);
      if (gVar25 != TOK_OP_GREATER) {
        pgVar30 = gnode_array_create();
        _Var22 = token_isidentifier(gVar25);
        if (_Var22) {
          do {
            pgVar28 = parse_id(parser);
            if (pgVar28 != (gnode_t *)0x0) {
              sVar38 = pgVar30->n;
              ppgVar31 = pgVar30->p;
              if (sVar38 == pgVar30->m) {
                sVar39 = sVar38 * 2;
                if (sVar38 == 0) {
                  sVar39 = 8;
                }
                pgVar30->m = sVar39;
                ppgVar31 = (gnode_t **)realloc(ppgVar31,sVar39 << 3);
                pgVar30->p = ppgVar31;
                sVar38 = pgVar30->n;
              }
              pgVar30->n = sVar38 + 1;
              ppgVar31[sVar38] = pgVar28;
            }
            gVar25 = gravity_lexer_peek(lexer);
            if (gVar25 != TOK_OP_COMMA) goto LAB_001100a7;
            gravity_lexer_next(lexer);
            _Var22 = token_isidentifier(TOK_OP_COMMA);
          } while (_Var22);
        }
        if (pgVar30 != (gnode_r *)0x0) {
          if (pgVar30->p != (gnode_t **)0x0) {
            free(pgVar30->p);
          }
          free(pgVar30);
        }
      }
      pgVar30 = (gnode_r *)0x0;
LAB_001100a7:
      parse_required(parser,TOK_OP_GREATER);
    }
    else {
      pgVar30 = (gnode_r *)0x0;
    }
    if (storage_specifier != TOK_KEY_EXTERN) {
      parse_required(parser,TOK_OP_OPEN_CURLYBRACE);
    }
    pgVar32 = gnode_array_create();
    parser_00 = (gravity_parser_t *)parser->declarations;
    pgVar28 = get_enclosing(parser_00,NODE_CLASS_DECL);
    if (pgVar28 != (gnode_t *)0x0) {
      declarations = gnode_array_create();
      pcVar33 = string_dup("outer");
      sVar38 = parser->declarations->n;
      if (sVar38 == 0) {
        pgVar28 = (gnode_t *)0x0;
      }
      else {
        pgVar28 = parser->declarations->p[sVar38 - 1];
      }
      pgVar28 = gnode_variable_create
                          ((gtoken_s)ZEXT840(0),pcVar33,(char *)0x0,(gnode_t *)0x0,pgVar28,
                           (gnode_variable_decl_t *)0x0);
      sVar38 = declarations->n;
      if (sVar38 == declarations->m) {
        sVar39 = 8;
        if (sVar38 != 0) {
          sVar39 = sVar38 * 2;
        }
        declarations->m = sVar39;
        ppgVar31 = (gnode_t **)realloc(declarations->p,sVar39 << 3);
        declarations->p = ppgVar31;
        sVar38 = declarations->n;
      }
      else {
        ppgVar31 = declarations->p;
      }
      declarations->n = sVar38 + 1;
      ppgVar31[sVar38] = pgVar28;
      sVar38 = parser->declarations->n;
      if (sVar38 == 0) {
        pgVar28 = (gnode_t *)0x0;
      }
      else {
        pgVar28 = parser->declarations->p[sVar38 - 1];
      }
      pgVar28 = gnode_variable_decl_create
                          ((gtoken_s)ZEXT840(0),TOK_KEY_VAR,TOK_KEY_PRIVATE,TOK_EOF,declarations,
                           pgVar28);
      sVar38 = pgVar32->n;
      if (sVar38 == pgVar32->m) {
        sVar39 = 8;
        if (sVar38 != 0) {
          sVar39 = sVar38 * 2;
        }
        pgVar32->m = sVar39;
        ppgVar31 = (gnode_t **)realloc(pgVar32->p,sVar39 << 3);
        pgVar32->p = ppgVar31;
        sVar38 = pgVar32->n;
      }
      else {
        ppgVar31 = pgVar32->p;
      }
      pgVar32->n = sVar38 + 1;
      ppgVar31[sVar38] = pgVar28;
      parser_00 = (gravity_parser_t *)parser->declarations;
    }
    if (parser_00->lexer == (lexer_r *)0x0) {
      pgVar28 = (gnode_t *)0x0;
    }
    else {
      pgVar28 = *(gnode_t **)((long)parser_00->statements + (long)parser_00->lexer * 8 + -8);
    }
    token_00.lineno = uStack_10c;
    token_00.type = local_110;
    token_00.colno = uStack_108;
    token_00.position = uStack_104;
    token_00.bytes = local_100;
    token_00.length = uStack_fc;
    token_00.fileid = uStack_f8;
    token_00.builtin = uStack_f4;
    token_00.value = local_f0;
    pgVar28 = gnode_class_decl_create
                        (token_00,pcVar29,access_specifier,storage_specifier,local_158,pgVar30,
                         (gnode_r *)0x0,gVar24 == TOK_KEY_STRUCT,pgVar28);
    if (storage_specifier != TOK_KEY_EXTERN) {
      pgVar30 = parser->declarations;
      sVar38 = pgVar30->n;
      if (sVar38 == pgVar30->m) {
        sVar39 = 8;
        if (sVar38 != 0) {
          sVar39 = sVar38 * 2;
        }
        pgVar30->m = sVar39;
        ppgVar31 = (gnode_t **)realloc(pgVar30->p,sVar39 << 3);
        pgVar30 = parser->declarations;
        pgVar30->p = ppgVar31;
        sVar38 = pgVar30->n;
      }
      else {
        ppgVar31 = pgVar30->p;
      }
      pgVar30->n = sVar38 + 1;
      ppgVar31[sVar38] = pgVar28;
      gVar24 = gravity_lexer_peek(pgVar3);
      while ((_Var22 = token_isdeclaration_statement(gVar24), _Var22 ||
             (_Var22 = token_ismacro(gVar24), _Var22))) {
        pgVar27 = parse_declaration_statement(parser);
        if (pgVar27 != (gnode_t *)0x0) {
          sVar38 = pgVar32->n;
          if (sVar38 == pgVar32->m) {
            sVar39 = sVar38 * 2;
            if (sVar38 == 0) {
              sVar39 = 8;
            }
            pgVar32->m = sVar39;
            ppgVar31 = (gnode_t **)realloc(pgVar32->p,sVar39 << 3);
            pgVar32->p = ppgVar31;
          }
          gVar1 = pgVar27->tag;
          if (gVar1 == NODE_FUNCTION_DECL) {
            pcVar33 = *(char **)&pgVar27[1].token.colno;
            if ((pcVar33 != (char *)0x0) && (pgVar27[1].block_length == 0)) {
              pgVar27[1].block_length = (uint)(*pcVar33 != '_') * 3 + 0x1a;
            }
          }
          else if (gVar1 == NODE_CLASS_DECL) {
            pcVar33 = *(char **)&pgVar27[1].token.colno;
            if ((pcVar33 != (char *)0x0) && (pgVar27[1].token.type == TOK_EOF)) {
              pgVar27[1].token.type = (uint)(*pcVar33 != '_') * 3 + TOK_KEY_PRIVATE;
            }
          }
          else if ((gVar1 == NODE_VARIABLE_DECL) && (pgVar27[1].refcount == 0)) {
            plVar4 = *(long **)&pgVar27[1].token;
            uVar26 = 0x1d;
            if ((plVar4 != (long *)0x0) &&
               ((*plVar4 != 0 && (*(char **)(*(long *)plVar4[2] + 0x50) != (char *)0x0)))) {
              uVar26 = (uint)(**(char **)(*(long *)plVar4[2] + 0x50) != '_') * 3 + 0x1a;
            }
            pgVar27[1].refcount = uVar26;
          }
          sVar38 = pgVar32->n;
          pgVar32->n = sVar38 + 1;
          pgVar32->p[sVar38] = pgVar27;
        }
        gVar24 = gravity_lexer_peek(pgVar3);
      }
      parser->declarations->n = parser->declarations->n - 1;
      parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
    }
    pgVar3 = parser->lexer->p[parser->lexer->n - 1];
    gVar24 = gravity_lexer_peek(pgVar3);
    if (gVar24 == TOK_OP_SEMICOLON) {
      gravity_lexer_next(pgVar3);
    }
    *(gnode_r **)&pgVar28[1].is_assignment = pgVar32;
    pgVar27 = get_enclosing((gravity_parser_t *)parser->declarations,NODE_FUNCTION_DECL);
    if (pgVar27 == (gnode_t *)0x0) {
      return pgVar28;
    }
    pcVar33 = string_dup(gravity_class_class->identifier);
    break;
  case TOK_KEY_CONST:
  case TOK_KEY_VAR:
    pgVar28 = parse_variable_declaration(parser,true,access_specifier,storage_specifier);
    return pgVar28;
  case TOK_KEY_MODULE:
    pgVar3 = parser->lexer->p[parser->lexer->n - 1];
    gVar24 = gravity_lexer_next(pgVar3);
    gravity_lexer_token(pgVar3);
    if (gVar24 != TOK_KEY_MODULE) {
      __assert_fail("type == TOK_KEY_MODULE",
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                    ,0x641,
                    "gnode_t *parse_module_declaration(gravity_parser_t *, gtoken_t, gtoken_t)");
    }
    parse_identifier(parser);
    _Var22 = parse_optional(parser,TOK_OP_OPEN_CURLYBRACE);
    pgVar30 = gnode_array_create();
    gVar24 = gravity_lexer_peek(pgVar3);
    _Var23 = token_isdeclaration_statement(gVar24);
    if (_Var23) {
      do {
        pgVar28 = parse_declaration_statement(parser);
        if (pgVar28 != (gnode_t *)0x0) {
          sVar38 = pgVar30->n;
          ppgVar31 = pgVar30->p;
          if (sVar38 == pgVar30->m) {
            sVar39 = sVar38 * 2;
            if (sVar38 == 0) {
              sVar39 = 8;
            }
            pgVar30->m = sVar39;
            ppgVar31 = (gnode_t **)realloc(ppgVar31,sVar39 << 3);
            pgVar30->p = ppgVar31;
            sVar38 = pgVar30->n;
          }
          pgVar30->n = sVar38 + 1;
          ppgVar31[sVar38] = pgVar28;
        }
        gVar24 = gravity_lexer_peek(pgVar3);
        _Var23 = token_isdeclaration_statement(gVar24);
      } while (_Var23);
    }
    if (_Var22) {
      parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
    }
    pgVar3 = parser->lexer->p[parser->lexer->n - 1];
    gVar24 = gravity_lexer_peek(pgVar3);
    if (gVar24 == TOK_OP_SEMICOLON) {
      gravity_lexer_next(pgVar3);
    }
    pcVar29 = "Module declarations not yet supported.";
    goto LAB_0010ffa8;
  case TOK_KEY_EVENT:
    pgVar3 = parser->lexer->p[parser->lexer->n - 1];
    gVar24 = gravity_lexer_next(pgVar3);
    gravity_lexer_token(pgVar3);
    if (gVar24 != TOK_KEY_EVENT) {
      __assert_fail("type == TOK_KEY_EVENT",
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                    ,0x669,
                    "gnode_t *parse_event_declaration(gravity_parser_t *, gtoken_t, gtoken_t)");
    }
    pcVar29 = "Event declarations not yet supported.";
LAB_0010ffa8:
    report_error(parser,GRAVITY_ERROR_SYNTAX,pcVar29);
    return (gnode_t *)0x0;
  default:
    if (gVar24 == TOK_OP_SEMICOLON) {
      if (access_specifier != TOK_EOF || storage_specifier != TOK_EOF) {
        gravity_lexer_token(pgVar3);
        report_error(parser,GRAVITY_ERROR_SYNTAX,0x13fd63);
      }
      pgVar28 = parse_empty_statement(parser);
      return pgVar28;
    }
  case TOK_KEY_PRIVATE:
  case TOK_KEY_FILE:
  case TOK_KEY_INTERNAL:
  case TOK_KEY_PUBLIC:
  case TOK_KEY_STATIC:
  case TOK_KEY_EXTERN:
  case TOK_KEY_LAZY:
  case TOK_KEY_IMPORT:
  case TOK_KEY_CASE:
switchD_0010fbd8_caseD_1a:
    gravity_lexer_token(pgVar3);
    pcVar29 = token_name(gVar24);
    report_error(parser,GRAVITY_ERROR_SYNTAX,0x13fd94,pcVar29);
    return (gnode_t *)0x0;
  }
  pgVar28 = local_store_declaration
                      (parser,pcVar29,pcVar33,access_specifier,storage_specifier,pgVar28);
  return pgVar28;
}

Assistant:

static gnode_t *parse_declaration_statement (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_declaration_statement");

    DECLARE_LEXER;
    gtoken_t peek = gravity_lexer_peek(lexer);
    gtoken_t access_specifier = 0;    // 0 means no access specifier set
    gtoken_t storage_specifier = 0;    // 0 means no storage specifier set

    // check if an access specifier is set
    if (token_isaccess_specifier(peek)) {
        access_specifier = gravity_lexer_next(lexer);
        peek = gravity_lexer_peek(lexer);
    }

    // check if a storage specifier is set
    if (token_isstorage_specifier(peek)) {
        storage_specifier = gravity_lexer_next(lexer);
        peek = gravity_lexer_peek(lexer);
    }

    // it is a syntax error to specify an access or storage specifier followed by an empty declaration
    if ((peek == TOK_OP_SEMICOLON) && ((access_specifier) || (storage_specifier))) {
        REPORT_ERROR(gravity_lexer_token(lexer), "Access or storage specifier cannot be used here.");
    }

    switch (peek) {
        case TOK_MACRO: return parse_macro_statement(parser);
        case TOK_KEY_FUNC: return parse_function_declaration(parser, access_specifier, storage_specifier);
        case TOK_KEY_ENUM: return parse_enum_declaration(parser, access_specifier, storage_specifier);
        case TOK_KEY_MODULE: return parse_module_declaration(parser, access_specifier, storage_specifier);
        case TOK_KEY_EVENT: return parse_event_declaration(parser, access_specifier, storage_specifier);
        case TOK_KEY_CLASS:
        case TOK_KEY_STRUCT: return parse_class_declaration(parser, access_specifier, storage_specifier);
        case TOK_OP_SEMICOLON: return parse_empty_statement(parser);
        case TOK_KEY_VAR:
        case TOK_KEY_CONST: return parse_variable_declaration(parser, true, access_specifier, storage_specifier);
        default: REPORT_ERROR(gravity_lexer_token(lexer), "Unrecognized token %s.", token_name(peek)); return NULL;
    }

    // should never reach this point
    assert(0);
    return NULL;
}